

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void api_suite::api_signed(void)

{
  char input [3];
  decoder_type decoder;
  value_type local_16c [4];
  value local_168 [2];
  basic_decoder<char> local_160;
  
  local_160.input.tail = local_16c + 2;
  local_16c[2] = 0;
  local_16c[0] = '4';
  local_16c[1] = '2';
  local_160.input.head = local_16c;
  memset(&local_160.current,0,0x120);
  local_160.current.code = uninitialized;
  local_160.current.view.head = (const_pointer)0x0;
  local_160.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_160);
  local_168[0] = local_160.current.code;
  local_168[1] = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x45,"void api_suite::api_signed()",local_168,local_168 + 1);
  local_168[0] = trial::protocol::json::detail::basic_decoder<char>::signed_value<int>(&local_160);
  local_168[1] = 0x2a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("decoder.signed_value<int>()","42",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x46,"void api_suite::api_signed()",local_168,local_168 + 1);
  return;
}

Assistant:

void api_signed()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<int>(), 42);
}